

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O2

void __thiscall
cmFilePathChecksum::cmFilePathChecksum(cmFilePathChecksum *this,cmMakefile *makefile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  long lVar3;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  paVar1 = &this->parentDirs[0].second.field_2;
  lVar3 = 0x100;
  do {
    paVar1[-3]._M_allocated_capacity = (size_type)(paVar1 + -2);
    *(undefined8 *)((long)paVar1 + -0x28) = 0;
    paVar1[-2]._M_local_buf[0] = 0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar1 + -1))->
    _M_dataplus)._M_p = (pointer)paVar1;
    *(size_type *)((long)paVar1 + -8) = 0;
    paVar1->_M_local_buf[0] = '\0';
    paVar1 = paVar1 + 4;
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != 0);
  pcVar2 = cmMakefile::GetCurrentSourceDirectory(makefile);
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_99);
  pcVar2 = cmMakefile::GetCurrentBinaryDirectory(makefile);
  std::__cxx11::string::string((string *)&local_58,pcVar2,&local_9a);
  pcVar2 = cmMakefile::GetHomeDirectory(makefile);
  std::__cxx11::string::string((string *)&local_78,pcVar2,&local_9b);
  pcVar2 = cmMakefile::GetHomeOutputDirectory(makefile);
  std::__cxx11::string::string((string *)&local_98,pcVar2,&local_9c);
  setupParentDirs(this,&local_38,&local_58,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

cmFilePathChecksum::cmFilePathChecksum(cmMakefile* makefile)
{
  setupParentDirs(makefile->GetCurrentSourceDirectory(),
                  makefile->GetCurrentBinaryDirectory(),
                  makefile->GetHomeDirectory(),
                  makefile->GetHomeOutputDirectory());
}